

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_graph.c
# Opt level: O0

void canvas_rminlet(_glist *x,_inlet *ip)

{
  int iVar1;
  bool bVar2;
  _glist *local_30;
  int redraw;
  _glist *owner;
  _inlet *ip_local;
  _glist *x_local;
  
  if ((*(ushort *)&x->field_0xe8 >> 0xb & 1) == 0) {
    local_30 = x->gl_owner;
  }
  else {
    local_30 = (_glist *)0x0;
  }
  bVar2 = false;
  if (local_30 != (_glist *)0x0) {
    iVar1 = glist_isvisible(local_30);
    bVar2 = false;
    if ((iVar1 != 0) && (bVar2 = false, (*(ushort *)&local_30->field_0xe8 >> 6 & 1) == 0)) {
      iVar1 = glist_istoplevel(local_30);
      bVar2 = iVar1 != 0;
    }
  }
  if (local_30 != (_glist *)0x0) {
    canvas_deletelinesforio(local_30,&x->gl_obj,ip,(_outlet *)0x0);
  }
  if (bVar2) {
    gobj_vis((t_gobj *)x,x->gl_owner,0);
  }
  inlet_free(ip);
  if (bVar2) {
    gobj_vis((t_gobj *)x,x->gl_owner,1);
    canvas_fixlinesfor(x->gl_owner,&x->gl_obj);
  }
  return;
}

Assistant:

void canvas_rminlet(t_canvas *x, t_inlet *ip)
{
    t_canvas *owner = x->gl_isclone ? NULL : x->gl_owner;
    int redraw = (owner && glist_isvisible(owner) && (!owner->gl_isdeleting)
        && glist_istoplevel(owner));

    if (owner) canvas_deletelinesforio(owner, &x->gl_obj, ip, 0);
    if (redraw)
        gobj_vis(&x->gl_gobj, x->gl_owner, 0);
    inlet_free(ip);
    if (redraw)
    {
        gobj_vis(&x->gl_gobj, x->gl_owner, 1);
        canvas_fixlinesfor(x->gl_owner, &x->gl_obj);
    }
}